

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSSetMassLinearSolver(void *arkode_mem,SUNLinearSolver LS,SUNMatrix M,int time_dep)

{
  long lVar1;
  double dVar2;
  SUNLinearSolver_Type SVar3;
  int iVar4;
  sunindextype sVar5;
  uint *__s;
  SUNMatrix p_Var6;
  char *pcVar7;
  N_Vector *v;
  int error_code;
  char *msgfmt;
  bool bVar8;
  
  if (arkode_mem == (void *)0x0) {
    pcVar7 = "arkLSSetMassLinearSolver";
    msgfmt = "Integrator memory is NULL.";
    iVar4 = -1;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -1;
    goto LAB_0040e1b3;
  }
  if (LS == (SUNLinearSolver)0x0) {
    pcVar7 = "arkLSSetMassLinearSolver";
    msgfmt = "LS must be non-NULL";
  }
  else if ((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
          (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_realtype *)0x0))
  {
    pcVar7 = "arkLSSetMassLinearSolver";
    msgfmt = "LS object is missing a required operation";
  }
  else {
    SVar3 = SUNLinSolGetType(LS);
    bVar8 = (SVar3 - SUNLINEARSOLVER_ITERATIVE & 0xfffffffd) != 0;
    lVar1 = *(long *)(*(long *)((long)arkode_mem + 0x120) + 8);
    if ((*(long *)(lVar1 + 0x58) == 0) || (*(long *)(lVar1 + 0xa0) == 0)) {
      pcVar7 = "arkLSSetMassLinearSolver";
LAB_0040e19f:
      msgfmt = "A required vector operation is not implemented.";
    }
    else if (M == (SUNMatrix)0x0 || SVar3 != SUNLINEARSOLVER_MATRIX_EMBEDDED) {
      if (SVar3 == SUNLINEARSOLVER_DIRECT) {
        if (M == (SUNMatrix)0x0) {
          pcVar7 = "arkLSSetMassLinearSolver";
          msgfmt = "Incompatible inputs: direct LS requires non-NULL matrix";
        }
        else {
LAB_0040e226:
          if ((*(long *)((long)arkode_mem + 0x90) != 0) && (*(long *)((long)arkode_mem + 0xb0) != 0)
             ) {
            __s = (uint *)malloc(0xe8);
            if (__s != (uint *)0x0) {
              memset(__s,0,0xe8);
              *(SUNLinearSolver *)(__s + 0x24) = LS;
              *__s = (uint)(SVar3 != SUNLINEARSOLVER_DIRECT);
              __s[1] = (uint)bVar8;
              __s[0xe] = time_dep;
              __s[2] = 0;
              __s[3] = 0;
              __s[8] = 0;
              __s[9] = 0;
              __s[0x2a] = 0;
              __s[0x2b] = 0;
              __s[0x2c] = 0;
              __s[0x2d] = 0;
              __s[0x2e] = 0;
              __s[0x2f] = 0;
              __s[0x32] = 0;
              __s[0x33] = 0;
              __s[0x34] = 0;
              __s[0x35] = 0;
              __s[0x36] = 0;
              __s[0x37] = 0;
              *(undefined8 *)(__s + 0x30) = *(undefined8 *)((long)arkode_mem + 0x10);
              __s[0x22] = 0;
              __s[0x23] = 0;
              __s[0x1e] = 0;
              __s[0x1f] = 0;
              __s[0x20] = 0;
              __s[0x21] = 0;
              __s[0x1a] = 0;
              __s[0x1b] = 0;
              __s[0x1c] = 0;
              __s[0x1d] = 0;
              __s[0x16] = 0;
              __s[0x17] = 0;
              __s[0x18] = 0;
              __s[0x19] = 0;
              __s[0x12] = 0;
              __s[0x13] = 0;
              __s[0x14] = 0;
              __s[0x15] = 0;
              __s[0x10] = 0xffffffff;
              __s[0x11] = 0xffefffff;
              __s[10] = 0x9999999a;
              __s[0xb] = 0x3fa99999;
              __s[0x38] = 0;
              if ((LS->ops->setatimes == (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) ||
                 (iVar4 = SUNLinSolSetATimes(LS,arkode_mem,(SUNATimesFn)0x0), iVar4 == 0)) {
                if ((LS->ops->setpreconditioner ==
                     (_func_int_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
                   (iVar4 = SUNLinSolSetPreconditioner
                                      (LS,arkode_mem,(SUNPSetupFn)0x0,(SUNPSolveFn)0x0), iVar4 == 0)
                   ) {
                  if (M != (SUNMatrix)0x0) {
                    *(SUNMatrix *)(__s + 4) = M;
                    if (SVar3 == SUNLINEARSOLVER_DIRECT) {
                      p_Var6 = SUNMatClone(M);
                      *(SUNMatrix *)(__s + 6) = p_Var6;
                      if (p_Var6 == (SUNMatrix)0x0) {
                        iVar4 = -4;
                        arkProcessError((ARKodeMem)arkode_mem,-4,"ARKLS","arkLSSetMassLinearSolver",
                                        "A memory request failed.");
                        goto LAB_0040e59f;
                      }
                    }
                    else {
                      *(SUNMatrix *)(__s + 6) = M;
                    }
                  }
                  v = (N_Vector *)(__s + 0x26);
                  iVar4 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x120),
                                      v);
                  if (iVar4 == 0) {
                    iVar4 = -4;
                    arkProcessError((ARKodeMem)arkode_mem,-4,"ARKLS","arkLSSetMassLinearSolver",
                                    "A memory request failed.");
                  }
                  else {
                    if (SVar3 != SUNLINEARSOLVER_DIRECT) {
                      sVar5 = N_VGetLength(*v);
                      if (sVar5 < 1) {
                        dVar2 = 0.0;
                      }
                      else {
                        sVar5 = N_VGetLength(*v);
                        dVar2 = (double)sVar5;
                        if (dVar2 < 0.0) {
                          dVar2 = sqrt(dVar2);
                        }
                        else {
                          dVar2 = SQRT(dVar2);
                        }
                      }
                      *(double *)(__s + 0xc) = dVar2;
                    }
                    iVar4 = (**(code **)((long)arkode_mem + 0x90))
                                      (arkode_mem,arkLsMassInitialize,arkLsMassSetup,arkLsMTimes,
                                       arkLsMassSolve,arkLsMassFree,time_dep,SVar3,__s);
                    if (iVar4 == 0) {
                      return 0;
                    }
                    arkProcessError((ARKodeMem)arkode_mem,iVar4,"ARKLS","arkLSSetMassLinearSolver",
                                    "Failed to attach to time stepper module");
                    N_VDestroy(*v);
                  }
                  if (SVar3 == SUNLINEARSOLVER_DIRECT) {
                    SUNMatDestroy(*(SUNMatrix *)(__s + 6));
                  }
                  goto LAB_0040e59f;
                }
                pcVar7 = "Error in calling SUNLinSolSetPreconditioner";
              }
              else {
                pcVar7 = "Error in calling SUNLinSolSetATimes";
              }
              iVar4 = -0xc;
              arkProcessError((ARKodeMem)arkode_mem,-0xc,"ARKLS","arkLSSetMassLinearSolver",pcVar7);
LAB_0040e59f:
              free(__s);
              return iVar4;
            }
            pcVar7 = "arkLSSetMassLinearSolver";
            msgfmt = "A memory request failed.";
            iVar4 = -4;
            error_code = -4;
            goto LAB_0040e1b3;
          }
          pcVar7 = "arkLSSetMassLinearSolver";
          msgfmt = "Missing time step module or associated routines";
        }
      }
      else {
        if (*(long *)(lVar1 + 0x48) == 0) {
          pcVar7 = "arkLSSetLinearSolver";
          goto LAB_0040e19f;
        }
        if (((SVar3 != SUNLINEARSOLVER_MATRIX_EMBEDDED) == bVar8) ||
           (LS->ops->setatimes != (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)) {
          if ((M != (SUNMatrix)0x0) ||
             ((SVar3 | SUNLINEARSOLVER_MATRIX_ITERATIVE) == SUNLINEARSOLVER_MATRIX_EMBEDDED))
          goto LAB_0040e226;
          pcVar7 = "arkLSSetMassLinearSolver";
          msgfmt = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
        }
        else {
          pcVar7 = "arkLSSetMassLinearSolver";
          msgfmt = "Incompatible inputs: iterative LS must support ATimes routine";
        }
      }
    }
    else {
      pcVar7 = "arkLSSetMassLinearSolver";
      msgfmt = "Incompatible inputs: matrix-embedded LS requires NULL matrix";
    }
  }
  iVar4 = -3;
  error_code = -3;
LAB_0040e1b3:
  arkProcessError((ARKodeMem)arkode_mem,error_code,"ARKLS",pcVar7,msgfmt);
  return iVar4;
}

Assistant:

int arkLSSetMassLinearSolver(void *arkode_mem, SUNLinearSolver LS,
                             SUNMatrix M, booleantype time_dep)
{
  ARKodeMem            ark_mem;
  ARKLsMassMem         arkls_mem;
  int                  retval;
  SUNLinearSolver_Type LSType;
  booleantype          iterative;    /* is the solver iterative?    */
  booleantype          matrixbased;  /* is a matrix structure used? */

  /* Return immediately if either arkode_mem or LS inputs are NULL */
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARKLS_MEM_NULL, "ARKLS",
                    "arkLSSetMassLinearSolver",
                    MSG_LS_ARKMEM_NULL);
    return(ARKLS_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  if (LS == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetMassLinearSolver",
                    "LS must be non-NULL");
    return(ARKLS_ILL_INPUT);
  }

  /* Test if solver is compatible with LS interface */
  if ( (LS->ops->gettype == NULL) || (LS->ops->solve == NULL) ) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                   "arkLSSetMassLinearSolver",
                   "LS object is missing a required operation");
    return(ARKLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if ( (ark_mem->tempv1->ops->nvconst == NULL) ||
       (ark_mem->tempv1->ops->nvwrmsnorm == NULL) ){
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetMassLinearSolver", MSG_LS_BAD_NVECTOR);
    return(ARKLS_ILL_INPUT);
  }

  /* Ensure that M is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (M != NULL)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassLinearSolver",
                    "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return(ARKLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative) {

    if (ark_mem->tempv1->ops->nvgetlength == NULL) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLSSetLinearSolver", MSG_LS_BAD_NVECTOR);
      return(ARKLS_ILL_INPUT);
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassLinearSolver",
                      "Incompatible inputs: iterative LS must support ATimes routine");
      return(ARKLS_ILL_INPUT);
    }

    if (matrixbased && (M == NULL)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassLinearSolver",
                      "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return(ARKLS_ILL_INPUT);
    }

  } else if (M == NULL) {

    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetMassLinearSolver",
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return(ARKLS_ILL_INPUT);

  }

  /* Test whether time stepper module is supplied, with required routines */
  if ( (ark_mem->step_attachmasssol == NULL) ||
       (ark_mem->step_getmassmem == NULL) ) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetMassLinearSolver",
                    "Missing time step module or associated routines");
    return(ARKLS_ILL_INPUT);
  }

  /* Allocate memory for ARKLsMemRec */
  arkls_mem = NULL;
  arkls_mem = (ARKLsMassMem) malloc(sizeof(struct ARKLsMassMemRec));
  if (arkls_mem == NULL) {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, "ARKLS",
                    "arkLSSetMassLinearSolver", MSG_LS_MEM_FAIL);
    return(ARKLS_MEM_FAIL);
  }
  memset(arkls_mem, 0, sizeof(struct ARKLsMassMemRec));

  /* set SUNLinearSolver pointer */
  arkls_mem->LS = LS;

  /* Linear solver type information */
  arkls_mem->iterative   = iterative;
  arkls_mem->matrixbased = matrixbased;

  /* Set flag indicating time-dependence */
  arkls_mem->time_dependent = time_dep;

  /* Set mass-matrix routines to NULL */
  arkls_mem->mass    = NULL;
  arkls_mem->M_data  = NULL;
  arkls_mem->mtsetup = NULL;
  arkls_mem->mtimes  = NULL;
  arkls_mem->mt_data = NULL;

  /* Set defaults for preconditioner-related fields */
  arkls_mem->pset   = NULL;
  arkls_mem->psolve = NULL;
  arkls_mem->pfree  = NULL;
  arkls_mem->P_data = ark_mem->user_data;

  /* Initialize counters */
  arkLsInitializeMassCounters(arkls_mem);

  /* Set default values for the rest of the LS parameters */
  arkls_mem->eplifac   = ARKLS_EPLIN;
  arkls_mem->last_flag = ARKLS_SUCCESS;

  /* If LS supports ATimes, attach ARKLs routine */
  if (LS->ops->setatimes) {
    retval = SUNLinSolSetATimes(LS, ark_mem, NULL);
    if (retval != SUNLS_SUCCESS) {
      arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, "ARKLS",
                      "arkLSSetMassLinearSolver",
                      "Error in calling SUNLinSolSetATimes");
      free(arkls_mem); arkls_mem = NULL;
      return(ARKLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner) {
    retval = SUNLinSolSetPreconditioner(LS, ark_mem, NULL, NULL);
    if (retval != SUNLS_SUCCESS) {
      arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, "ARKLS",
                      "arkLSSetMassLinearSolver",
                      "Error in calling SUNLinSolSetPreconditioner");
      free(arkls_mem); arkls_mem = NULL;
      return(ARKLS_SUNLS_FAIL);
    }
  }

  /* When using a non-NULL SUNMatrix object, store pointer to M and, for direct
     linear solvers, create M_lu to store the factorization of M */
  if (M != NULL) {
    arkls_mem->M = M;
    if (!iterative) {
      arkls_mem->M_lu = SUNMatClone(M);
      if (arkls_mem->M_lu == NULL) {
        arkProcessError(ark_mem, ARKLS_MEM_FAIL, "ARKLS",
                        "arkLSSetMassLinearSolver", MSG_LS_MEM_FAIL);
        free(arkls_mem); arkls_mem = NULL;
        return(ARKLS_MEM_FAIL);
      }
    } else {
      arkls_mem->M_lu = M;
    }
  }

  /* Allocate memory for x */
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(arkls_mem->x))) {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, "ARKLS",
                    "arkLSSetMassLinearSolver", MSG_LS_MEM_FAIL);
    if (!iterative) SUNMatDestroy(arkls_mem->M_lu);
    free(arkls_mem); arkls_mem = NULL;
    return(ARKLS_MEM_FAIL);
  }

  /* For iterative LS, compute default norm conversion factor */
  if (iterative)
    arkls_mem->nrmfac = SUNRsqrt( N_VGetLength(arkls_mem->x) );

  /* Attach ARKLs interface to time stepper module */
  retval = ark_mem->step_attachmasssol(arkode_mem, arkLsMassInitialize,
                                       arkLsMassSetup, arkLsMTimes,
                                       arkLsMassSolve, arkLsMassFree,
                                       time_dep, LSType, arkls_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKLS", "arkLSSetMassLinearSolver",
                    "Failed to attach to time stepper module");
    N_VDestroy(arkls_mem->x);
    if (!iterative) SUNMatDestroy(arkls_mem->M_lu);
    free(arkls_mem); arkls_mem = NULL;
    return(retval);
  }

  return(ARKLS_SUCCESS);
}